

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

ClauseStack * __thiscall
Inferences::InductionClauseIterator::produceClauses
          (ClauseStack *__return_storage_ptr__,InductionClauseIterator *this,Formula *hypothesis,
          InferenceRule rule,InductionContext *context,
          DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *bindings)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  FormulaUnit *pFVar4;
  ostream *poVar5;
  _Hash_node_base *p_Var6;
  Inference inf;
  NewCNF cnf;
  undefined1 local_2c8 [32];
  void *local_2a8;
  float fStack_2a0;
  float fStack_29c;
  char *local_290;
  size_type sStack_288;
  SplitSet *local_280;
  void *pvStack_278;
  void *local_270;
  float fStack_268;
  float fStack_264;
  NewCNF local_260;
  
  Shell::NewCNF::NewCNF(&local_260,0);
  local_260._forInduction = true;
  __return_storage_ptr__->_cursor = (Clause **)0x0;
  __return_storage_ptr__->_end = (Clause **)0x0;
  __return_storage_ptr__->_capacity = 0;
  __return_storage_ptr__->_stack = (Clause **)0x0;
  local_2c8._0_8_ = (ulong)CONCAT61(local_2c8._2_6_,rule) << 8;
  Kernel::Inference::Inference((Inference *)&local_290,(NonspecificInference0 *)local_2c8);
  p_Var6 = (context->_cls)._M_h._M_before_begin._M_nxt;
  if (p_Var6 == (_Hash_node_base *)0x0) {
    uVar3 = 0x200000;
  }
  else {
    uVar1 = 0;
    do {
      uVar2 = *(uint *)&p_Var6[1]._M_nxt[1]._M_nxt >> 0x15 & 0x1f;
      if (uVar2 < uVar1) {
        uVar2 = uVar1;
      }
      uVar1 = uVar2;
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
    uVar3 = (ulong)(uVar1 * 0x200000 + 0x200000 & 0x3e00000);
  }
  local_290 = (char *)((ulong)local_290 & 0xfffffffffc1fffff | uVar3);
  pFVar4 = (FormulaUnit *)::operator_new(0x48,8);
  local_2a8 = local_270;
  fStack_2a0 = fStack_268;
  fStack_29c = fStack_264;
  local_2c8._16_8_ = local_280;
  local_2c8._24_8_ = pvStack_278;
  local_2c8._0_8_ = local_290;
  local_2c8._8_8_ = sStack_288;
  Kernel::Unit::Unit((Unit *)pFVar4,FORMULA,(Inference *)local_2c8);
  pFVar4->_formula = hypothesis;
  pFVar4->_cachedColor = COLOR_INVALID;
  pFVar4->_cachedWeight = 0;
  Kernel::Unit::doUnitTracing((Unit *)pFVar4);
  if (((this->_opt->_showAll).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 != '\0')
     || (((this->_opt->_showInduction).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92
         & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Induction] formula ",0x14);
    Kernel::FormulaUnit::toString_abi_cxx11_((string *)local_2c8,pFVar4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
  }
  pFVar4 = Shell::NNF::ennf(pFVar4);
  Shell::NewCNF::clausify(&local_260,pFVar4,__return_storage_ptr__,bindings);
  if ((byte)(rule + INTERNAL_GENERATING_INFERNCE_LAST) < 10) {
    *(int *)(DAT_00b7e1c0 +
            *(long *)(&DAT_00914d48 + (ulong)(byte)(rule + INTERNAL_GENERATING_INFERNCE_LAST) * 8))
         = *(int *)(DAT_00b7e1c0 +
                   *(long *)(&DAT_00914d48 +
                            (ulong)(byte)(rule + INTERNAL_GENERATING_INFERNCE_LAST) * 8)) + 1;
    if ((byte)(rule + BINARY_CONN_ELIMINATION) < 6) {
      *(int *)(DAT_00b7e1c0 +
              *(long *)(&DAT_00914d98 + (ulong)(byte)(rule + BINARY_CONN_ELIMINATION) * 8)) =
           *(int *)(DAT_00b7e1c0 +
                   *(long *)(&DAT_00914d98 + (ulong)(byte)(rule + BINARY_CONN_ELIMINATION) * 8)) + 1
      ;
    }
  }
  Shell::NewCNF::~NewCNF(&local_260);
  return __return_storage_ptr__;
}

Assistant:

ClauseStack InductionClauseIterator::produceClauses(Formula* hypothesis, InferenceRule rule, const InductionContext& context, DHMap<unsigned, Term*>* bindings)
{
  NewCNF cnf(0);
  cnf.setForInduction();
  Stack<Clause*> hyp_clauses;
  Inference inf = NonspecificInference0(UnitInputType::AXIOM,rule);
  unsigned maxInductionDepth = 0;
  for (const auto& kv : context._cls) {
    maxInductionDepth = max(maxInductionDepth,kv.first->inference().inductionDepth());
  }
  inf.setInductionDepth(maxInductionDepth+1);
  FormulaUnit* fu = new FormulaUnit(hypothesis,inf);
  if(_opt.showInduction()){
    std::cout << "[Induction] formula " << fu->toString() << endl;
  }
  cnf.clausify(NNF::ennf(fu), hyp_clauses, bindings);

  switch (rule) {
    case InferenceRule::STRUCT_INDUCTION_AXIOM_ONE:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_TWO:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_THREE:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_RECURSION:
      env.statistics->structInduction++;
      break;
    case InferenceRule::INT_INF_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM:
      env.statistics->intInfInduction++;
      break;
    case InferenceRule::INT_FIN_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM:
      env.statistics->intFinInduction++;
      break;
    case InferenceRule::INT_DB_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM:
      env.statistics->intDBInduction++;
      break;
    default:
      ;
  }
  switch (rule) {
    case InferenceRule::INT_INF_UP_INDUCTION_AXIOM:
      env.statistics->intInfUpInduction++;
      break;
    case InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM:
      env.statistics->intInfDownInduction++;
      break;
    case InferenceRule::INT_FIN_UP_INDUCTION_AXIOM:
      env.statistics->intFinUpInduction++;
      break;
    case InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM:
      env.statistics->intFinDownInduction++;
      break;
    case InferenceRule::INT_DB_UP_INDUCTION_AXIOM:
      env.statistics->intDBUpInduction++;
      break;
    case InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM:
      env.statistics->intDBDownInduction++;
      break;
    default:
      ;
  }

  return hyp_clauses;
}